

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int luv_fs_unlink(lua_State *L)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  uv_fs_t *req;
  luv_req_t *plVar5;
  uv_loop_t *loop;
  char *pcVar6;
  char *pcVar7;
  code *cb;
  
  iVar3 = 1;
  pcVar4 = luaL_checklstring(L,1,(size_t *)0x0);
  iVar1 = luv_check_continuation(L,2);
  req = (uv_fs_t *)lua_newuserdata(L,0x1b8);
  plVar5 = luv_setup_req(L,iVar1);
  req->data = plVar5;
  iVar1 = plVar5->callback_ref;
  loop = luv_loop(L);
  cb = luv_fs_cb;
  if (iVar1 == -2) {
    cb = (uv_fs_cb)0x0;
  }
  iVar2 = uv_fs_unlink(loop,req,pcVar4,cb);
  if ((req->fs_type == UV_FS_ACCESS) || (-1 < iVar2)) {
    if (iVar1 == -2) {
      iVar3 = push_fs_result(L,req);
      if (req->fs_type != UV_FS_SCANDIR) {
        luv_cleanup_req(L,(luv_req_t *)req->data);
        req->data = (void *)0x0;
        uv_fs_req_cleanup(req);
      }
    }
    else {
      lua_rawgeti(L,-0xf4628,(long)plVar5->req_ref);
    }
  }
  else {
    lua_pushnil(L);
    pcVar4 = req->path;
    pcVar6 = uv_err_name((int)req->result);
    pcVar7 = uv_strerror((int)req->result);
    if (pcVar4 == (char *)0x0) {
      lua_pushfstring(L,"%s: %s",pcVar6,pcVar7);
    }
    else {
      lua_pushfstring(L,"%s: %s: %s",pcVar6,pcVar7,req->path);
    }
    pcVar4 = uv_err_name((int)req->result);
    lua_pushstring(L,pcVar4);
    luv_cleanup_req(L,(luv_req_t *)req->data);
    req->data = (void *)0x0;
    uv_fs_req_cleanup(req);
    iVar3 = 3;
  }
  return iVar3;
}

Assistant:

static int luv_fs_unlink(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  const char* path = luaL_checkstring(L, 1);
  int ref = luv_check_continuation(L, 2);
  uv_fs_t* req = (uv_fs_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);
  FS_CALL(unlink, req, path);
}